

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

void print_usage(int param_1,char **argv)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  _func_char_ptr_ggml_type *f;
  _func_char_ptr_ggml_type *f_00;
  undefined4 in_register_0000003c;
  allocator<char> local_69;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_values;
  string local_30;
  
  printf("usage: %s [options]\n",*(undefined8 *)CONCAT44(in_register_0000003c,param_1));
  putchar(10);
  puts("options:");
  puts("  -h, --help");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<std::__cxx11::string>(&local_30,&cmd_params_defaults.model,&local_68);
  printf("  -m, --model <filename>                    (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.n_prompt,&local_68);
  printf("  -p, --n-prompt <n>                        (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.n_gen,&local_68);
  printf("  -n, --n-gen <n>                           (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string(*)(std::pair<int,int>const&)>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )cmd_params_defaults.n_pg.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )cmd_params_defaults.n_pg.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&str_values,pair_str_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,",",&local_69);
  join<std::__cxx11::string>(&local_30,&str_values,&local_68);
  printf("  -pg <pp,tg>                               (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&str_values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.n_batch,&local_68);
  printf("  -b, --batch-size <n>                      (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.n_ubatch,&local_68);
  printf("  -ub, --ubatch-size <n>                    (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  transform_to_str<ggml_type,char_const*(*)(ggml_type)>(&str_values,&cmd_params_defaults.type_k,f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,",",&local_69);
  join<std::__cxx11::string>(&local_30,&str_values,&local_68);
  printf("  -ctk, --cache-type-k <t>                  (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&str_values);
  transform_to_str<ggml_type,char_const*(*)(ggml_type)>
            (&str_values,&cmd_params_defaults.type_v,f_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,",",&local_69);
  join<std::__cxx11::string>(&local_30,&str_values,&local_68);
  printf("  -ctv, --cache-type-v <t>                  (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&str_values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.n_threads,&local_68);
  printf("  -t, --threads <n>                         (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<std::__cxx11::string>(&local_30,&cmd_params_defaults.cpu_mask,&local_68);
  printf("  -C, --cpu-mask <hex,hex>                  (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<bool>(&local_30,&cmd_params_defaults.cpu_strict,&local_68);
  printf("  --cpu-strict <0|1>                        (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.poll,&local_68);
  printf("  --poll <0...100>                          (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.n_gpu_layers,&local_68);
  printf("  -ngl, --n-gpu-layers <n>                  (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  cVar2 = llama_supports_rpc();
  if (cVar2 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,",",(allocator<char> *)&str_values);
    join<std::__cxx11::string>(&local_30,&cmd_params_defaults.rpc_servers,&local_68);
    printf("  -rpc, --rpc <rpc_servers>                 (default: %s)\n",local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_68);
  }
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<llama_split_mode_const*,std::vector<llama_split_mode,std::allocator<llama_split_mode>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*(*)(llama_split_mode)>
            ((__normal_iterator<const_llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
              )cmd_params_defaults.split_mode.
               super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_llama_split_mode_*,_std::vector<llama_split_mode,_std::allocator<llama_split_mode>_>_>
              )cmd_params_defaults.split_mode.
               super__Vector_base<llama_split_mode,_std::allocator<llama_split_mode>_>._M_impl.
               super__Vector_impl_data._M_finish,&str_values,split_mode_str);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,",",&local_69);
  join<std::__cxx11::string>(&local_30,&str_values,&local_68);
  printf("  -sm, --split-mode <none|layer|row>        (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&str_values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<int>(&local_30,&cmd_params_defaults.main_gpu,&local_68);
  printf("  -mg, --main-gpu <i>                       (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<bool>(&local_30,&cmd_params_defaults.no_kv_offload,&local_68);
  printf("  -nkvo, --no-kv-offload <0|1>              (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<bool>(&local_30,&cmd_params_defaults.flash_attn,&local_68);
  printf("  -fa, --flash-attn <0|1>                   (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<bool>(&local_30,&cmd_params_defaults.use_mmap,&local_68);
  printf("  -mmp, --mmap <0|1>                        (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  puts("  --numa <distribute|isolate|numactl>       (default: disabled)");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,",",(allocator<char> *)&str_values);
  join<bool>(&local_30,&cmd_params_defaults.embeddings,&local_68);
  printf("  -embd, --embeddings <0|1>                 (default: %s)\n",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_68);
  puts("  -ts, --tensor-split <ts0/ts1/..>          (default: 0)");
  printf("  -r, --repetitions <n>                     (default: %d)\n",
         (ulong)(uint)cmd_params_defaults.reps);
  printf("  --prio <0|1|2|3>                          (default: %d)\n",
         (ulong)cmd_params_defaults.prio);
  printf("  --delay <0...N> (seconds)                 (default: %d)\n",
         (ulong)(uint)cmd_params_defaults.delay);
  pcVar3 = output_format_str(cmd_params_defaults.output_format);
  printf("  -o, --output <csv|json|jsonl|md|sql>      (default: %s)\n",pcVar3);
  pcVar3 = output_format_str(cmd_params_defaults.output_format_stderr);
  printf("  -oe, --output-err <csv|json|jsonl|md|sql> (default: %s)\n",pcVar3);
  pcVar1 = "\\$0";
  pcVar3 = "\\$0";
  if (cmd_params_defaults.verbose != false) {
    pcVar3 = "DC1";
  }
  printf("  -v, --verbose                             (default: %s)\n",pcVar3 + 2);
  if (cmd_params_defaults.progress != false) {
    pcVar1 = "DC1";
  }
  printf("  --progress                                (default: %s)\n",pcVar1 + 2);
  putchar(10);
  puts(
      "Multiple values can be given for each parameter by separating them with \',\' or by specifying the parameter multiple times."
      );
  return;
}

Assistant:

static void print_usage(int /* argc */, char ** argv) {
    printf("usage: %s [options]\n", argv[0]);
    printf("\n");
    printf("options:\n");
    printf("  -h, --help\n");
    printf("  -m, --model <filename>                    (default: %s)\n", join(cmd_params_defaults.model, ",").c_str());
    printf("  -p, --n-prompt <n>                        (default: %s)\n",
           join(cmd_params_defaults.n_prompt, ",").c_str());
    printf("  -n, --n-gen <n>                           (default: %s)\n", join(cmd_params_defaults.n_gen, ",").c_str());
    printf("  -pg <pp,tg>                               (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.n_pg, pair_str), ",").c_str());
    printf("  -b, --batch-size <n>                      (default: %s)\n",
           join(cmd_params_defaults.n_batch, ",").c_str());
    printf("  -ub, --ubatch-size <n>                    (default: %s)\n",
           join(cmd_params_defaults.n_ubatch, ",").c_str());
    printf("  -ctk, --cache-type-k <t>                  (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.type_k, ggml_type_name), ",").c_str());
    printf("  -ctv, --cache-type-v <t>                  (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.type_v, ggml_type_name), ",").c_str());
    printf("  -t, --threads <n>                         (default: %s)\n",
           join(cmd_params_defaults.n_threads, ",").c_str());
    printf("  -C, --cpu-mask <hex,hex>                  (default: %s)\n",
           join(cmd_params_defaults.cpu_mask, ",").c_str());
    printf("  --cpu-strict <0|1>                        (default: %s)\n",
           join(cmd_params_defaults.cpu_strict, ",").c_str());
    printf("  --poll <0...100>                          (default: %s)\n", join(cmd_params_defaults.poll, ",").c_str());
    printf("  -ngl, --n-gpu-layers <n>                  (default: %s)\n",
           join(cmd_params_defaults.n_gpu_layers, ",").c_str());
    if (llama_supports_rpc()) {
        printf("  -rpc, --rpc <rpc_servers>                 (default: %s)\n",
               join(cmd_params_defaults.rpc_servers, ",").c_str());
    }
    printf("  -sm, --split-mode <none|layer|row>        (default: %s)\n",
           join(transform_to_str(cmd_params_defaults.split_mode, split_mode_str), ",").c_str());
    printf("  -mg, --main-gpu <i>                       (default: %s)\n",
           join(cmd_params_defaults.main_gpu, ",").c_str());
    printf("  -nkvo, --no-kv-offload <0|1>              (default: %s)\n",
           join(cmd_params_defaults.no_kv_offload, ",").c_str());
    printf("  -fa, --flash-attn <0|1>                   (default: %s)\n",
           join(cmd_params_defaults.flash_attn, ",").c_str());
    printf("  -mmp, --mmap <0|1>                        (default: %s)\n",
           join(cmd_params_defaults.use_mmap, ",").c_str());
    printf("  --numa <distribute|isolate|numactl>       (default: disabled)\n");
    printf("  -embd, --embeddings <0|1>                 (default: %s)\n",
           join(cmd_params_defaults.embeddings, ",").c_str());
    printf("  -ts, --tensor-split <ts0/ts1/..>          (default: 0)\n");
    printf("  -r, --repetitions <n>                     (default: %d)\n", cmd_params_defaults.reps);
    printf("  --prio <0|1|2|3>                          (default: %d)\n", cmd_params_defaults.prio);
    printf("  --delay <0...N> (seconds)                 (default: %d)\n", cmd_params_defaults.delay);
    printf("  -o, --output <csv|json|jsonl|md|sql>      (default: %s)\n",
           output_format_str(cmd_params_defaults.output_format));
    printf("  -oe, --output-err <csv|json|jsonl|md|sql> (default: %s)\n",
           output_format_str(cmd_params_defaults.output_format_stderr));
    printf("  -v, --verbose                             (default: %s)\n", cmd_params_defaults.verbose ? "1" : "0");
    printf("  --progress                                (default: %s)\n", cmd_params_defaults.progress ? "1" : "0");
    printf("\n");
    printf(
        "Multiple values can be given for each parameter by separating them with ',' or by specifying the parameter "
        "multiple times.\n");
}